

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O1

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitUnaryNeg(AsmJSByteCodeGenerator *this,ParseNode *pnode)

{
  AsmJsType *this_00;
  AsmJsByteCodeWriter *this_01;
  AsmJsFunc *pAVar1;
  bool bVar2;
  Types TVar3;
  RegSlot R0;
  ParseNodeUni *pPVar4;
  RegisterSpace *pRVar5;
  AsmJsCompilationException *this_02;
  ulong uVar6;
  EmitExpressionInfo local_30;
  
  pPVar4 = ParseNode::AsParseNodeUni(pnode);
  local_30 = Emit(this,pPVar4->pnode1);
  this_00 = &local_30.type;
  this_01 = &this->mWriter;
  ByteCodeWriter::StartStatement(&this_01->super_ByteCodeWriter,pnode,0);
  bVar2 = AsmJsType::isInt(this_00);
  if (bVar2) {
    pAVar1 = this->mFunction;
    TVar3 = WAsmJs::FromPrimitiveType<int>();
    pRVar5 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                       (&pAVar1->mTypedRegisterAllocator,TVar3);
    if ((local_30.super_EmitInfoBase.location != 0xffffffff) &&
       (local_30.super_EmitInfoBase.location < pRVar5->mRegisterCount)) {
      R0 = GetAndReleaseUnaryLocations<int>(this,&local_30);
      AsmJsByteCodeWriter::AsmReg2(this_01,Neg_Int,R0,local_30.super_EmitInfoBase.location);
      uVar6 = 0xc00000000;
LAB_00947c55:
      ByteCodeWriter::EndStatement(&this_01->super_ByteCodeWriter,pnode);
      return (EmitExpressionInfo)(R0 | uVar6);
    }
    this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException
              (this_02,L"Invalid Node location[%d] ",(ulong)local_30 & 0xffffffff);
  }
  else {
    bVar2 = AsmJsType::isMaybeDouble(this_00);
    if (bVar2) {
      pAVar1 = this->mFunction;
      TVar3 = WAsmJs::FromPrimitiveType<double>();
      pRVar5 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar1->mTypedRegisterAllocator,TVar3);
      if ((local_30.super_EmitInfoBase.location != 0xffffffff) &&
         (local_30.super_EmitInfoBase.location < pRVar5->mRegisterCount)) {
        R0 = GetAndReleaseUnaryLocations<double>(this,&local_30);
        AsmJsByteCodeWriter::AsmReg2(this_01,Neg_Db,R0,local_30.super_EmitInfoBase.location);
        uVar6 = 0x200000000;
        goto LAB_00947c55;
      }
      this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (this_02,L"Invalid Node location[%d] ",(ulong)local_30 & 0xffffffff);
    }
    else {
      bVar2 = AsmJsType::isMaybeFloat(this_00);
      if (bVar2) {
        pAVar1 = this->mFunction;
        TVar3 = WAsmJs::FromPrimitiveType<float>();
        pRVar5 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                           (&pAVar1->mTypedRegisterAllocator,TVar3);
        if ((local_30.super_EmitInfoBase.location != 0xffffffff) &&
           (local_30.super_EmitInfoBase.location < pRVar5->mRegisterCount)) {
          R0 = GetAndReleaseUnaryLocations<float>(this,&local_30);
          AsmJsByteCodeWriter::AsmReg2(this_01,Neg_Flt,R0,local_30.super_EmitInfoBase.location);
          uVar6 = 0x700000000;
          goto LAB_00947c55;
        }
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"Invalid Node location[%d] ",(ulong)local_30 & 0xffffffff);
      }
      else {
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"Type not supported for unary -");
      }
    }
  }
  __cxa_throw(this_02,&AsmJsCompilationException::typeinfo,0);
}

Assistant:

Js::EmitExpressionInfo AsmJSByteCodeGenerator::EmitUnaryNeg( ParseNode * pnode )
    {
        ParseNode* rhs = ParserWrapper::GetUnaryNode( pnode );
        const EmitExpressionInfo& rhsEmit = Emit( rhs );
        const AsmJsType& rType = rhsEmit.type;
        StartStatement(pnode);
        EmitExpressionInfo emitInfo;
        if( rType.isInt() )
        {
            CheckNodeLocation( rhsEmit, int );
            RegSlot dst = GetAndReleaseUnaryLocations<int>( &rhsEmit );
            emitInfo.type = AsmJsType::Intish;
            mWriter.AsmReg2( OpCodeAsmJs::Neg_Int, dst, rhsEmit.location );
            emitInfo.location = dst;
        }
        else if (rType.isMaybeDouble())
        {
            CheckNodeLocation( rhsEmit, double );
            RegSlot dst = GetAndReleaseUnaryLocations<double>( &rhsEmit );
            emitInfo.type = AsmJsType::Double;
            mWriter.AsmReg2( OpCodeAsmJs::Neg_Db, dst, rhsEmit.location );
            emitInfo.location = dst;
        }
        else if (rType.isMaybeFloat())
        {
            CheckNodeLocation(rhsEmit, float);
            RegSlot dst = GetAndReleaseUnaryLocations<float>(&rhsEmit);
            emitInfo.type = AsmJsType::Floatish;
            mWriter.AsmReg2(OpCodeAsmJs::Neg_Flt, dst, rhsEmit.location);
            emitInfo.location = dst;
        }
        else
        {
            throw AsmJsCompilationException( _u("Type not supported for unary -") );
        }
        EndStatement(pnode);
        return emitInfo;
    }